

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O2

void __thiscall CodeGenerator::writeProperties(CodeGenerator *this,ostream *s,Class *clazz)

{
  string *psVar1;
  string *this_00;
  pointer pPVar2;
  undefined8 uVar3;
  int iVar4;
  ostream *poVar5;
  pointer pPVar6;
  undefined1 local_b0 [8];
  Property i;
  string name;
  
  poVar5 = std::operator<<(s,"    // properties");
  std::endl<char,std::char_traits<char>>(poVar5);
  pPVar2 = (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
           super__Vector_impl_data._M_finish;
  psVar1 = (string *)(i.name.field_2._M_local_buf + 8);
  this_00 = (string *)(i.type.field_2._M_local_buf + 8);
  for (pPVar6 = (clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
                super__Vector_impl_data._M_start; pPVar6 != pPVar2; pPVar6 = pPVar6 + 1) {
    Property::Property((Property *)local_b0,pPVar6);
    std::__cxx11::string::string(this_00,(string *)&i);
    uVar3 = i.type.field_2._8_8_;
    iVar4 = toupper((int)*(char *)i.type.field_2._8_8_);
    *(char *)uVar3 = (char)iVar4;
    poVar5 = std::operator<<(s,"    static rengine::Signal<> on");
    poVar5 = std::operator<<(poVar5,this_00);
    poVar5 = std::operator<<(poVar5,"Changed;");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"    const ");
    poVar5 = std::operator<<(poVar5,psVar1);
    poVar5 = std::operator<<(poVar5," &");
    poVar5 = std::operator<<(poVar5,(string *)&i);
    poVar5 = std::operator<<(poVar5,"() const {");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"        return m_");
    poVar5 = std::operator<<(poVar5,(string *)&i);
    poVar5 = std::operator<<(poVar5,";");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"    }");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"    void set");
    poVar5 = std::operator<<(poVar5,this_00);
    poVar5 = std::operator<<(poVar5,"(const ");
    poVar5 = std::operator<<(poVar5,psVar1);
    poVar5 = std::operator<<(poVar5," &");
    poVar5 = std::operator<<(poVar5,(string *)&i);
    poVar5 = std::operator<<(poVar5,") {");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"        if (m_");
    poVar5 = std::operator<<(poVar5,(string *)&i);
    poVar5 = std::operator<<(poVar5," == ");
    poVar5 = std::operator<<(poVar5,(string *)&i);
    poVar5 = std::operator<<(poVar5,")");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"            return;");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"        m_");
    poVar5 = std::operator<<(poVar5,(string *)&i);
    poVar5 = std::operator<<(poVar5," = ");
    poVar5 = std::operator<<(poVar5,(string *)&i);
    poVar5 = std::operator<<(poVar5,";");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"        on");
    poVar5 = std::operator<<(poVar5,this_00);
    poVar5 = std::operator<<(poVar5,"Changed.emit(this);");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(poVar5,"    }");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string(this_00);
    Property::~Property((Property *)local_b0);
  }
  return;
}

Assistant:

void CodeGenerator::writeProperties(std::ostream &s, Class *clazz)
{
    s << "    // properties" << std::endl;
    for (auto i : clazz->properties) {
        std::string name = i.name;
        name[0] = std::toupper(name[0]);
        s << "    static rengine::Signal<> on" << name << "Changed;" << std::endl
          << "    const " << i.type << " &" << i.name << "() const {" << std::endl
          << "        return m_" << i.name << ";" << std::endl
          << "    }" << std::endl
          << "    void set" << name << "(const " << i.type << " &" << i.name << ") {" << std::endl
          << "        if (m_" << i.name << " == " << i.name << ")" << std::endl
          << "            return;" << std::endl
          << "        m_" << i.name << " = " << i.name << ";" << std::endl
          << "        on" << name << "Changed.emit(this);" << std::endl
          << "    }" << std::endl
          << std::endl;
    }
}